

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::weibull_dist<double>::icdf(weibull_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar2;
  double dVar3;
  result_type_conflict2 rVar4;
  undefined8 local_8;
  
  if ((in_XMM0_Qa < 0.0) || (1.0 <= in_XMM0_Qa)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_8 = std::numeric_limits<double>::quiet_NaN();
  }
  else {
    rVar2 = param_type::theta(in_RDI);
    dVar3 = math::ln1p(1.70563565552721e-317);
    rVar4 = param_type::beta(in_RDI);
    local_8 = pow(-dVar3,1.0 / rVar4);
    local_8 = rVar2 * local_8;
  }
  return local_8;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x >= 1) {
#if !(defined __CUDA_ARCH__)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return P.theta() * math::pow(-math::ln1p(-x), 1 / P.beta());
    }